

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

int gdImageColorClosestAlpha(gdImagePtr im,int r,int g,int b,int a)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long dist;
  long mindist;
  int first;
  int ct;
  long ad;
  long bd;
  long gd;
  long rd;
  int i;
  int a_local;
  int b_local;
  int g_local;
  int r_local;
  gdImagePtr im_local;
  
  mindist._4_4_ = -1;
  bVar1 = true;
  dist = 0;
  if (im->trueColor == 0) {
    for (rd._4_4_ = 0; rd._4_4_ < im->colorsTotal; rd._4_4_ = rd._4_4_ + 1) {
      if ((im->open[rd._4_4_] == 0) &&
         ((lVar2 = (long)(im->red[rd._4_4_] - r), lVar3 = (long)(im->green[rd._4_4_] - g),
          lVar4 = (long)(im->blue[rd._4_4_] - b), lVar5 = (long)(im->alpha[rd._4_4_] - a),
          lVar2 = lVar2 * lVar2 + lVar3 * lVar3 + lVar4 * lVar4 + lVar5 * lVar5, bVar1 ||
          (lVar2 < dist)))) {
        mindist._4_4_ = rd._4_4_;
        bVar1 = false;
        dist = lVar2;
      }
    }
    im_local._4_4_ = mindist._4_4_;
  }
  else {
    im_local._4_4_ = a * 0x1000000 + r * 0x10000 + g * 0x100 + b;
  }
  return im_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageColorClosestAlpha (gdImagePtr im, int r, int g, int b, int a)
{
	int i;
	long rd, gd, bd, ad;
	int ct = (-1);
	int first = 1;
	long mindist = 0;
	if (im->trueColor) {
		return gdTrueColorAlpha (r, g, b, a);
	}
	for (i = 0; (i < (im->colorsTotal)); i++) {
		long dist;
		if (im->open[i]) {
			continue;
		}
		rd = (im->red[i] - r);
		gd = (im->green[i] - g);
		bd = (im->blue[i] - b);
		/* gd 2.02: whoops, was - b (thanks to David Marwood) */
		/* gd 2.16: was blue rather than alpha! Geez! Thanks to
		   Artur Jakub Jerzak */
		ad = (im->alpha[i] - a);
		dist = rd * rd + gd * gd + bd * bd + ad * ad;
		if (first || (dist < mindist)) {
			mindist = dist;
			ct = i;
			first = 0;
		}
	}
	return ct;
}